

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifstreambuf.cpp
# Opt level: O0

int_type __thiscall sai::ifstreambuf::underflow(ifstreambuf *this)

{
  bool bVar1;
  int_type iVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  char_type *__c;
  fpos<__mbstate_t> local_48;
  fpos<__mbstate_t> local_38;
  fpos<__mbstate_t> local_28;
  ifstreambuf *local_18;
  ifstreambuf *this_local;
  
  local_18 = this;
  uVar3 = std::ios::eof();
  if ((uVar3 & 1) == 0) {
    lVar4 = std::streambuf::gptr();
    lVar5 = std::streambuf::egptr();
    if (lVar4 == lVar5) {
      std::fpos<__mbstate_t>::fpos(&local_38,(ulong)(this->CurrentPage + 1) << 0xc);
      local_28 = (fpos<__mbstate_t>)
                 (**(code **)(*(long *)this + 0x28))(this,local_38._M_off,local_38._M_state,8);
      std::fpos<__mbstate_t>::fpos(&local_48,-1);
      bVar1 = std::operator==(&local_28,&local_48);
      if (bVar1) {
        iVar2 = std::char_traits<char>::eof();
        return iVar2;
      }
    }
    __c = (char_type *)std::streambuf::gptr();
    this_local._4_4_ = std::char_traits<char>::to_int_type(__c);
  }
  else {
    this_local._4_4_ = std::char_traits<char>::eof();
  }
  return this_local._4_4_;
}

Assistant:

std::streambuf::int_type ifstreambuf::underflow()
{
	if( FileIn.eof() )
	{
		return traits_type::eof();
	}

	if( gptr() == egptr() )
	{
		// buffer depleated, get next block
		if( seekpos((CurrentPage + 1) * VirtualPage::PageSize)
			== std::streampos(std::streamoff(-1)) )
		{
			// Seek position error
			return traits_type::eof();
		}
	}

	return traits_type::to_int_type(*gptr());
}